

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_copy.cpp
# Opt level: O0

bool Image2Trinity(string *path,string *param_2)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int exec_addr_00;
  int uSize_;
  int iVar4;
  char *__s1;
  exception *peVar5;
  element_type *peVar6;
  int *piVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  uint8_t *puVar9;
  uchar *puVar10;
  const_reference pvVar11;
  pointer pTVar12;
  long lVar13;
  char *local_168;
  char *local_160;
  undefined1 local_158 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  devices;
  unique_ptr<Trinity,_std::default_delete<Trinity>_> trinity;
  Data *data;
  int local_128;
  int uBlock;
  Header local_11c;
  byte local_10a;
  byte local_109;
  int local_108;
  uint8_t head;
  uint8_t cyl;
  int uOffset;
  uint8_t sec;
  uint8_t trk;
  MEMORY mem;
  int uPos;
  int file_length;
  int exec_addr;
  int start_addr;
  allocator local_a9;
  string local_a8 [32];
  int local_88;
  int entry;
  int local_74;
  undefined4 local_70;
  int sector;
  string local_60 [8];
  string name;
  MGT_DIR *pdir;
  Sector *s;
  shared_ptr<Disk> disk;
  string *param_1_local;
  string *path_local;
  
  disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_2;
  std::make_shared<Disk>();
  pdir = (MGT_DIR *)0x0;
  name.field_2._8_8_ = 0;
  std::__cxx11::string::string(local_60);
  bVar1 = ReadImage(path,(shared_ptr<Disk> *)&s,true);
  if (bVar1) {
    for (local_74 = 1; name.field_2._8_8_ == 0 && local_74 < 0xb; local_74 = local_74 + 1) {
      peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&s)
      ;
      Header::Header((Header *)&stack0xffffffffffffff7c,0,0,local_74,2);
      bVar1 = Disk::find(peVar6,(Header *)&stack0xffffffffffffff7c,(Sector **)&pdir);
      if (((bVar1 ^ 0xffU) & 1) != 0) break;
      for (local_88 = 0; name.field_2._8_8_ == 0 && local_88 < 2; local_88 = local_88 + 1) {
        pvVar8 = &Sector::data_copy((Sector *)pdir,0)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar8);
        name.field_2._8_8_ = puVar10 + (local_88 << 8);
        puVar10 = (uchar *)(name.field_2._8_8_ + 1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,(char *)puVar10,10,&local_a9);
        std::__cxx11::string::operator=(local_60,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        bVar1 = false;
        bVar2 = true;
        if (((*(byte *)name.field_2._8_8_ & 0x3f) == 0x13) &&
           (bVar2 = true, *(char *)(name.field_2._8_8_ + 0xf2) != -1)) {
          std::__cxx11::string::substr((ulong)&start_addr,(ulong)local_60);
          bVar1 = true;
          __s1 = (char *)std::__cxx11::string::c_str();
          iVar3 = strcasecmp(__s1,"auto");
          bVar2 = iVar3 != 0;
        }
        if (bVar1) {
          std::__cxx11::string::~string((string *)&start_addr);
        }
        if (bVar2) {
          name.field_2._8_8_ = 0;
        }
      }
    }
    if (name.field_2._8_8_ == 0) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[38]>
                (peVar5,(char (*) [38])"no suitable auto-executing code found");
      __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
    }
    iVar3 = TPeek((uint8_t *)(name.field_2._8_8_ + 0xec),0x4000);
    exec_addr_00 = TPeek((uint8_t *)(name.field_2._8_8_ + 0xf2),0);
    uSize_ = TPeek((uint8_t *)(name.field_2._8_8_ + 0xef),0);
    if ((iVar3 < 0x8000) && (0x5fff < iVar3 + uSize_)) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[47]>
                (peVar5,(char (*) [47])"code overlaps 6000-7fff range used by TrinLoad");
      __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
    }
    mem.pb._4_4_ = 0;
    MEMORY::MEMORY((MEMORY *)&uOffset,uSize_);
    cyl = *(uint8_t *)(name.field_2._8_8_ + 0xd);
    head = *(uint8_t *)(name.field_2._8_8_ + 0xe);
    local_108 = 9;
    while (mem.pb._4_4_ < uSize_) {
      local_109 = cyl & 0x7f;
      local_10a = cyl >> 7;
      peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&s)
      ;
      Header::Header(&local_11c,(uint)local_109,(uint)local_10a,(uint)head,2);
      bVar2 = Disk::find(peVar6,&local_11c,(Sector **)&pdir);
      bVar1 = true;
      if (bVar2) {
        iVar4 = Sector::data_size((Sector *)pdir);
        bVar1 = iVar4 != 0x200;
      }
      if (bVar1) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        CylHead::CylHead((CylHead *)&stack0xfffffffffffffedc,(uint)local_109,(uint)local_10a);
        util::exception::exception<char_const(&)[21],CylHead,char_const(&)[8],unsigned_char&>
                  (peVar5,(char (*) [21])"end of file reading ",(CylHead *)&stack0xfffffffffffffedc,
                   (char (*) [8])0x2a81d7,&head);
        __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
      }
      data._4_4_ = uSize_ - mem.pb._4_4_;
      data._0_4_ = 0x1fe - local_108;
      piVar7 = std::min<int>((int *)((long)&data + 4),(int *)&data);
      local_128 = *piVar7;
      pvVar8 = &Sector::data_copy((Sector *)pdir,0)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      puVar9 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&uOffset);
      lVar13 = (long)mem.pb._4_4_;
      puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar8);
      memcpy(puVar9 + lVar13,puVar10 + local_108,(long)local_128);
      mem.pb._4_4_ = local_128 + mem.pb._4_4_;
      local_108 = 0;
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar8,0x1fe)
      ;
      cyl = *pvVar11;
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar8,0x1ff)
      ;
      head = *pvVar11;
    }
    Trinity::Open();
    pTVar12 = std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::operator->
                        ((unique_ptr<Trinity,_std::default_delete<Trinity>_> *)
                         &devices.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Trinity::devices_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_158,pTVar12);
    local_160 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_158,0);
    local_168 = (char *)std::__cxx11::string::c_str();
    Message<char_const*,char_const*>(msgStatus,"Sending %s to %s...",&local_160,&local_168);
    pTVar12 = std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::operator->
                        ((unique_ptr<Trinity,_std::default_delete<Trinity>_> *)
                         &devices.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar9 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&uOffset);
    Trinity::send_file(pTVar12,puVar9,(int)mem._vptr_MEMORY,iVar3,exec_addr_00);
    path_local._7_1_ = true;
    local_70 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_158);
    std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::~unique_ptr
              ((unique_ptr<Trinity,_std::default_delete<Trinity>_> *)
               &devices.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    MEMORY::~MEMORY((MEMORY *)&uOffset);
  }
  else {
    path_local._7_1_ = false;
    local_70 = 1;
  }
  std::__cxx11::string::~string(local_60);
  std::shared_ptr<Disk>::~shared_ptr((shared_ptr<Disk> *)&s);
  return path_local._7_1_;
}

Assistant:

bool Image2Trinity(const std::string& path, const std::string&/*trinity_path*/) // ToDo: use trinity_path for record
{
    auto disk = std::make_shared<Disk>();
    const Sector* s = nullptr;
    const MGT_DIR* pdir = nullptr;
    std::string name;

    if (!ReadImage(path, disk))
        return false;

    // Scanning the first 10 directory sectors should be enough
    for (auto sector = 1; !pdir && sector <= MGT_SECTORS; ++sector)
    {
        if (!disk->find(Header(0, 0, sector, 2), s))
            break;

        // Each sector contains 2 MGT directory entries
        for (auto entry = 0; !pdir && entry < 2; ++entry)
        {
            pdir = reinterpret_cast<const MGT_DIR*>(s->data_copy().data() + 256 * entry);

            // Extract the first 4 characters of a potential MGT filename
            name = std::string(reinterpret_cast<const char*>(pdir->abName), 10);

            // Reject if not a code file, or no auto-execute, or not named AUTO*
            if ((pdir->bType & 0x3f) != 19 || pdir->bExecutePage == 0xff ||
                strcasecmp(name.substr(0, 4).c_str(), "auto"))
                pdir = nullptr;
        }
    }

    if (!pdir)
        throw util::exception("no suitable auto-executing code found");

    auto start_addr = TPeek(&pdir->bStartPage, 16384);
    auto exec_addr = TPeek(&pdir->bExecutePage);
    auto file_length = TPeek(&pdir->bLengthInPages);

    // Check the code wouldn't overwrite TrinLoad
    if (start_addr < 0x8000 && (start_addr + file_length) >= 0x6000)
        throw util::exception("code overlaps 6000-7fff range used by TrinLoad");

    auto uPos = 0;
    MEMORY mem(file_length);

    // The file start sector is taken from the directory entry.
    // Code files have a 9-byte metadata header, which must be skipped.
    auto trk = pdir->bStartTrack;
    auto sec = pdir->bStartSector;
    auto uOffset = MGT_FILE_HEADER_SIZE;

    // Loop until we've read the full file
    while (uPos < file_length)
    {
        // Bit 7 of the track number indicates head 1
        uint8_t cyl = (trk & 0x7f);
        uint8_t head = trk >> 7;

        if (!disk->find(Header(cyl, head, sec, 2), s) || s->data_size() != SECTOR_SIZE)
            throw util::exception("end of file reading ", CylHead(cyl, head), " sector", sec);

        // Determine the size of data in this sector, which is at most 510 bytes.
        // The final 2 bytes contain the location of the next sector.
        auto uBlock = std::min(file_length - uPos, 510 - uOffset);
        auto& data = s->data_copy();

        memcpy(mem + uPos, data.data() + uOffset, uBlock);
        uPos += uBlock;
        uOffset = 0;

        // Follow the chain to the next sector
        trk = data[510];
        sec = data[511];
    }

    // Scan the local network for SAM machines running TrinLoad
    auto trinity = Trinity::Open();
    auto devices = trinity->devices();

    // Send the code file to the first device that responded
    Message(msgStatus, "Sending %s to %s...", name.c_str(), devices[0].c_str());
    trinity->send_file(mem, mem.size, start_addr, exec_addr);

    return true;
}